

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode Variant_decodeBinary(UA_Variant *dst,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_Byte *pUVar2;
  byte bVar3;
  UA_Byte UVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  UA_DataType *pUVar11;
  UA_NodeId local_48;
  
  pUVar1 = pos + 1;
  if (end < pUVar1) {
    return 0x80070000;
  }
  bVar3 = *pos;
  if (bVar3 == 0) {
    pos = pUVar1;
    return 0;
  }
  uVar9 = (ulong)(bVar3 & 0x3f) - 1;
  if (0x18 < uVar9) {
    pos = pUVar1;
    return 0x80070000;
  }
  pUVar11 = UA_TYPES + uVar9;
  pos = pUVar1;
  dst->type = pUVar11;
  pUVar1 = pos;
  if ((char)bVar3 < '\0') {
    UVar5 = Array_decodeBinary(&dst->data,&dst->arrayLength,pUVar11);
    goto LAB_0011319f;
  }
  if (uVar9 != 0x15) {
    pvVar7 = calloc(1,(ulong)UA_TYPES[uVar9].memSize);
    dst->data = pvVar7;
    if (pvVar7 == (void *)0x0) {
      return 0x80030000;
    }
    UVar5 = (*encodeBinaryJumpTable[(ulong)(bVar3 & 0x3f) + 0x19])(pvVar7,pUVar11);
    goto LAB_0011319f;
  }
  local_48.namespaceIndex = 0;
  local_48._2_2_ = 0;
  local_48.identifierType = UA_NODEIDTYPE_NUMERIC;
  local_48.identifier.string.length = 0;
  local_48.identifier.string.data = (UA_Byte *)0x0;
  UVar5 = NodeId_decodeBinary(&local_48,_);
  if (UVar5 != 0) goto LAB_0011319f;
  pUVar2 = pos + 1;
  if (end < pUVar2) {
    UVar5 = 0x80070000;
    deleteMembers_noInit(&local_48,UA_TYPES + 0x10);
    local_48.namespaceIndex = 0;
    local_48._2_2_ = 0;
    local_48.identifierType = UA_NODEIDTYPE_NUMERIC;
    local_48.identifier.string.length = 0;
    local_48.identifier.string.data = (UA_Byte *)0x0;
    goto LAB_0011319f;
  }
  UVar4 = *pos;
  pos = pUVar2;
  if ((UVar4 == '\x01' && local_48.identifierType == UA_NODEIDTYPE_NUMERIC) &&
     (local_48.namespaceIndex == 0)) {
    lVar8 = 0;
    do {
      uVar10 = (uint)*(ushort *)((long)&UA_TYPES[0].binaryEncodingId + lVar8);
      if (local_48.identifier.numeric == uVar10) {
        dst->type = (UA_DataType *)((long)&UA_TYPES[0].typeName + lVar8);
        break;
      }
      lVar8 = lVar8 + 0x30;
    } while (lVar8 != 0x1e90);
    if (local_48.identifier.numeric != uVar10) goto LAB_0011325b;
    pos = pos + 4;
  }
  else {
LAB_0011325b:
    if (dst->type != (UA_DataType *)0x13f7a0) {
      __assert_fail("dst->type == &UA_TYPES[21]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                    ,0x1ab3,"UA_StatusCode Variant_decodeBinaryUnwrapExtensionObject(UA_Variant *)")
      ;
    }
    pos = pUVar1;
    deleteMembers_noInit(&local_48,UA_TYPES + 0x10);
    local_48.namespaceIndex = 0;
    local_48._2_2_ = 0;
    local_48.identifierType = UA_NODEIDTYPE_NUMERIC;
    local_48.identifier.string.length = 0;
    local_48.identifier.string.data = (UA_Byte *)0x0;
  }
  pUVar11 = dst->type;
  pvVar7 = calloc(1,(ulong)pUVar11->memSize);
  dst->data = pvVar7;
  if (pvVar7 == (void *)0x0) {
    UVar5 = 0x80030000;
  }
  else {
    uVar9 = 0x19;
    if ((pUVar11->field_0x25 & 1) != 0) {
      uVar9 = (ulong)pUVar11->typeIndex;
    }
    UVar5 = (*decodeBinaryJumpTable[uVar9])(pvVar7,pUVar11);
    if (UVar5 != 0) {
      free(dst->data);
      dst->data = (void *)0x0;
    }
  }
LAB_0011319f:
  if (0xbf < bVar3) {
    UVar6 = Array_decodeBinary(&dst->arrayDimensions,&dst->arrayDimensionsSize,UA_TYPES + 5);
    UVar5 = UVar5 | UVar6;
  }
  return UVar5;
}

Assistant:

static UA_StatusCode
Variant_decodeBinary(UA_Variant *dst, const UA_DataType *_) {
    /* Decode the encoding byte */
    UA_Byte encodingByte;
    UA_StatusCode retval = Byte_decodeBinary(&encodingByte, NULL);
    if(retval != UA_STATUSCODE_GOOD)
        return retval;

    /* Return early for an empty variant (was already _inited) */
    if(encodingByte == 0)
        return UA_STATUSCODE_GOOD;

    /* Does the variant contain an array? */
    const UA_Boolean isArray = (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_ARRAY) > 0;

    /* Get the datatype of the content. The type must be a builtin data type.
     * All not-builtin types are wrapped in an ExtensionObject. */
    size_t typeIndex = (size_t)((encodingByte & UA_VARIANT_ENCODINGMASKTYPE_TYPEID_MASK) - 1);
    if(typeIndex > UA_TYPES_DIAGNOSTICINFO)
        return UA_STATUSCODE_BADDECODINGERROR;
    dst->type = &UA_TYPES[typeIndex];

    /* Decode the content */
    if(isArray) {
        retval = Array_decodeBinary(&dst->data, &dst->arrayLength, dst->type);
    } else if(typeIndex != UA_TYPES_EXTENSIONOBJECT) {
        dst->data = UA_new(dst->type);
        if(!dst->data)
            return UA_STATUSCODE_BADOUTOFMEMORY;
        retval = decodeBinaryJumpTable[typeIndex](dst->data, dst->type);
    } else {
        retval = Variant_decodeBinaryUnwrapExtensionObject(dst);
    }

    /* Decode array dimensions */
    if(isArray && (encodingByte & UA_VARIANT_ENCODINGMASKTYPE_DIMENSIONS) > 0)
        retval |= Array_decodeBinary((void**)&dst->arrayDimensions,
                                     &dst->arrayDimensionsSize, &UA_TYPES[UA_TYPES_INT32]);
    return retval;
}